

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I2cAnalyzerResults.cpp
# Opt level: O3

void __thiscall
I2cAnalyzerResults::GenerateFrameTabularText
          (I2cAnalyzerResults *this,U64 frame_index,DisplayBase display_base)

{
  size_t sVar1;
  char ack [32];
  Frame frame;
  stringstream ss;
  char number_str [128];
  char *local_298;
  char local_288 [16];
  undefined8 local_278;
  char acStack_270 [24];
  Frame local_258 [16];
  byte local_248;
  undefined7 uStack_247;
  char local_238;
  byte local_237;
  stringstream local_230 [16];
  ostream local_220 [112];
  ios_base local_1b0 [264];
  char local_a8 [136];
  
  AnalyzerResults::ClearTabularText();
  AnalyzerResults::GetFrame((ulonglong)local_258);
  if ((local_237 & 1) == 0) {
    if ((local_237 & 2) == 0) {
      local_278._0_4_ = 0x4b414e;
    }
    else {
      local_278._0_1_ = 'M';
      local_278._1_1_ = 'i';
      local_278._2_1_ = 's';
      local_278._3_1_ = 's';
      local_278._4_1_ = 'i';
      local_278._5_1_ = 'n';
      local_278._6_1_ = 'g';
      local_278._7_1_ = ' ';
      builtin_strncpy(acStack_270,"ACK/NAK",8);
    }
  }
  else {
    local_278._0_4_ = 0x4b4341;
  }
  if (local_238 == '\0') {
    AnalyzerHelpers::GetNumberString
              (CONCAT71(uStack_247,local_248) >> 1,display_base,7,local_a8,0x80);
    if ((local_248 & 1) == 0) {
      std::__cxx11::stringstream::stringstream(local_230);
      std::__ostream_insert<char,std::char_traits<char>>(local_220,"Setup Write to [",0x10);
      sVar1 = strlen(local_a8);
      std::__ostream_insert<char,std::char_traits<char>>(local_220,local_a8,sVar1);
      std::__ostream_insert<char,std::char_traits<char>>(local_220,"] + ",4);
      sVar1 = strlen((char *)&local_278);
      std::__ostream_insert<char,std::char_traits<char>>(local_220,(char *)&local_278,sVar1);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddTabularText
                ((char *)this,local_298,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
    else {
      std::__cxx11::stringstream::stringstream(local_230);
      std::__ostream_insert<char,std::char_traits<char>>(local_220,"Setup Read to [",0xf);
      sVar1 = strlen(local_a8);
      std::__ostream_insert<char,std::char_traits<char>>(local_220,local_a8,sVar1);
      std::__ostream_insert<char,std::char_traits<char>>(local_220,"] + ",4);
      sVar1 = strlen((char *)&local_278);
      std::__ostream_insert<char,std::char_traits<char>>(local_220,(char *)&local_278,sVar1);
      std::__cxx11::stringbuf::str();
      AnalyzerResults::AddTabularText
                ((char *)this,local_298,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
    }
  }
  else {
    AnalyzerHelpers::GetNumberString(CONCAT71(uStack_247,local_248),display_base,8,local_a8,0x80);
    std::__cxx11::stringstream::stringstream(local_230);
    sVar1 = strlen(local_a8);
    std::__ostream_insert<char,std::char_traits<char>>(local_220,local_a8,sVar1);
    std::__ostream_insert<char,std::char_traits<char>>(local_220," + ",3);
    sVar1 = strlen((char *)&local_278);
    std::__ostream_insert<char,std::char_traits<char>>(local_220,(char *)&local_278,sVar1);
    std::__cxx11::stringbuf::str();
    AnalyzerResults::AddTabularText
              ((char *)this,local_298,(char *)0x0,(char *)0x0,(char *)0x0,(char *)0x0);
  }
  if (local_298 != local_288) {
    operator_delete(local_298);
  }
  std::__cxx11::stringstream::~stringstream(local_230);
  std::ios_base::~ios_base(local_1b0);
  Frame::~Frame(local_258);
  return;
}

Assistant:

void I2cAnalyzerResults::GenerateFrameTabularText( U64 frame_index, DisplayBase display_base )
{
    ClearTabularText();

    Frame frame = GetFrame( frame_index );

    char ack[ 32 ];
    if( ( frame.mFlags & I2C_FLAG_ACK ) != 0 )
        snprintf( ack, sizeof( ack ), "ACK" );
    else if( ( frame.mFlags & I2C_MISSING_FLAG_ACK ) != 0 )
        snprintf( ack, sizeof( ack ), "Missing ACK/NAK" );
    else
        snprintf( ack, sizeof( ack ), "NAK" );

    if( frame.mType == I2cAddress )
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1 >> 1, display_base, 7, number_str, 128 );

        I2cDirection direction;
        if( ( frame.mData1 & 0x1 ) != 0 )
            direction = I2C_READ;
        else
            direction = I2C_WRITE;

        if( direction == I2C_READ )
        {
            std::stringstream ss;
            ss << "Setup Read to [" << number_str << "] + " << ack;
            AddTabularText( ss.str().c_str() );
        }
        else
        {
            std::stringstream ss;
            ss << "Setup Write to [" << number_str << "] + " << ack;
            AddTabularText( ss.str().c_str() );
        }
    }
    else
    {
        char number_str[ 128 ];
        AnalyzerHelpers::GetNumberString( frame.mData1, display_base, 8, number_str, 128 );
        std::stringstream ss;
        ss << number_str << " + " << ack;
        AddTabularText( ss.str().c_str() );
    }
}